

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void mi_stats_merge_from(mi_stats_t *stats)

{
  long lVar1;
  
  if (stats != &_mi_stats_main) {
    mi_stat_count_add_mt(&_mi_stats_main.pages,&stats->pages);
    mi_stat_count_add_mt(&_mi_stats_main.reserved,&stats->reserved);
    mi_stat_count_add_mt(&_mi_stats_main.committed,&stats->committed);
    mi_stat_count_add_mt(&_mi_stats_main.reset,&stats->reset);
    mi_stat_count_add_mt(&_mi_stats_main.purged,&stats->purged);
    mi_stat_count_add_mt(&_mi_stats_main.page_committed,&stats->page_committed);
    mi_stat_count_add_mt(&_mi_stats_main.pages_abandoned,&stats->pages_abandoned);
    mi_stat_count_add_mt(&_mi_stats_main.threads,&stats->threads);
    mi_stat_count_add_mt(&_mi_stats_main.malloc_normal,&stats->malloc_normal);
    mi_stat_count_add_mt(&_mi_stats_main.malloc_huge,&stats->malloc_huge);
    mi_stat_count_add_mt(&_mi_stats_main.malloc_requested,&stats->malloc_requested);
    lVar1 = (stats->mmap_calls).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.mmap_calls.total = _mi_stats_main.mmap_calls.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->commit_calls).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.commit_calls.total = _mi_stats_main.commit_calls.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->reset_calls).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.reset_calls.total = _mi_stats_main.reset_calls.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->purge_calls).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.purge_calls.total = _mi_stats_main.purge_calls.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->arena_count).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.arena_count.total = _mi_stats_main.arena_count.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->malloc_normal_count).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.malloc_normal_count.total = _mi_stats_main.malloc_normal_count.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->malloc_huge_count).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.malloc_huge_count.total = _mi_stats_main.malloc_huge_count.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->malloc_guarded_count).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.malloc_guarded_count.total = _mi_stats_main.malloc_guarded_count.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->arena_rollback_count).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.arena_rollback_count.total = _mi_stats_main.arena_rollback_count.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->arena_purges).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.arena_purges.total = _mi_stats_main.arena_purges.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->pages_extended).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_extended.total = _mi_stats_main.pages_extended.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->pages_retire).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_retire.total = _mi_stats_main.pages_retire.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->page_searches).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.page_searches.total = _mi_stats_main.page_searches.total + lVar1;
      UNLOCK();
    }
    mi_stat_count_add_mt(&_mi_stats_main.segments,&stats->segments);
    mi_stat_count_add_mt(&_mi_stats_main.segments_abandoned,&stats->segments_abandoned);
    mi_stat_count_add_mt(&_mi_stats_main.segments_cache,&stats->segments_cache);
    mi_stat_count_add_mt(&_mi_stats_main._segments_reserved,&stats->_segments_reserved);
    lVar1 = (stats->pages_reclaim_on_alloc).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_reclaim_on_alloc.total =
           _mi_stats_main.pages_reclaim_on_alloc.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->pages_reclaim_on_free).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_reclaim_on_free.total =
           _mi_stats_main.pages_reclaim_on_free.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->pages_reabandon_full).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_reabandon_full.total = _mi_stats_main.pages_reabandon_full.total + lVar1;
      UNLOCK();
    }
    lVar1 = (stats->pages_unabandon_busy_wait).total;
    if (lVar1 != 0) {
      LOCK();
      _mi_stats_main.pages_unabandon_busy_wait.total =
           _mi_stats_main.pages_unabandon_busy_wait.total + lVar1;
      UNLOCK();
    }
    for (lVar1 = 0x968; lVar1 != 0x1058; lVar1 = lVar1 + 0x18) {
      mi_stat_count_add_mt
                ((mi_stat_count_t *)((long)&_mi_stats_main.version + lVar1),
                 (mi_stat_count_t *)((long)&stats->version + lVar1));
    }
    memset(stats,0,0x1058);
    return;
  }
  return;
}

Assistant:

static void mi_stats_merge_from(mi_stats_t* stats) {
  if (stats != &_mi_stats_main) {
    mi_stats_add(&_mi_stats_main, stats);
    memset(stats, 0, sizeof(mi_stats_t));
  }
}